

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

int av1_get_force_skip_low_temp_var_small_sb
              (uint8_t *variance_low,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int iVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  iVar1 = (int)CONCAT71(in_register_00000009,bsize);
  if (iVar1 - 6U < 7) {
    uVar3 = mi_row & 0xf;
    uVar2 = mi_col & 0xf;
    switch(iVar1) {
    default:
      variance_low = variance_low +
                     *(int *)((long)pos_shift_16x16[0] +
                             (ulong)(mi_col & 0xc) + (ulong)(mi_row & 0xc) * 4);
      break;
    case 9:
      if (((mi_col | mi_row) & 0xfU) == 0) {
        variance_low = variance_low + 5;
      }
      else if (uVar2 == 0 || uVar3 != 0) {
        if (uVar3 == 0 || uVar2 != 0) {
          if (uVar2 == 0 || uVar3 == 0) {
            return 0;
          }
          variance_low = variance_low + 8;
        }
        else {
          variance_low = variance_low + 7;
        }
      }
      else {
        variance_low = variance_low + 6;
      }
      break;
    case 10:
      if (((mi_col | mi_row) & 0xfU) == 0) {
        variance_low = variance_low + 3;
      }
      else {
        if (uVar2 == 0 || uVar3 != 0) {
          return 0;
        }
        variance_low = variance_low + 4;
      }
      break;
    case 0xb:
      if (((mi_col | mi_row) & 0xfU) == 0) {
        variance_low = variance_low + 1;
      }
      else {
        if (uVar2 != 0 || uVar3 == 0) {
          return 0;
        }
        variance_low = variance_low + 2;
      }
      break;
    case 0xc:
      break;
    }
    uVar2 = (uint)*variance_low;
  }
  return uVar2;
}

Assistant:

int av1_get_force_skip_low_temp_var_small_sb(const uint8_t *variance_low,
                                             int mi_row, int mi_col,
                                             BLOCK_SIZE bsize) {
  // Relative indices of MB inside the superblock.
  const int mi_x = mi_row & 0xF;
  const int mi_y = mi_col & 0xF;
  // Relative indices of 16x16 block inside the superblock.
  const int i = mi_x >> 2;
  const int j = mi_y >> 2;
  int force_skip_low_temp_var = 0;
  // Set force_skip_low_temp_var based on the block size and block offset.
  switch (bsize) {
    case BLOCK_64X64: force_skip_low_temp_var = variance_low[0]; break;
    case BLOCK_64X32:
      if (!mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[1];
      } else if (!mi_y && mi_x) {
        force_skip_low_temp_var = variance_low[2];
      }
      break;
    case BLOCK_32X64:
      if (!mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[3];
      } else if (mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[4];
      }
      break;
    case BLOCK_32X32:
      if (!mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[5];
      } else if (mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[6];
      } else if (!mi_y && mi_x) {
        force_skip_low_temp_var = variance_low[7];
      } else if (mi_y && mi_x) {
        force_skip_low_temp_var = variance_low[8];
      }
      break;
    case BLOCK_32X16:
    case BLOCK_16X32:
    case BLOCK_16X16:
      force_skip_low_temp_var = variance_low[pos_shift_16x16[i][j]];
      break;
    default: break;
  }

  return force_skip_low_temp_var;
}